

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O1

void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *ctx,int is_enc,void *key,size_t key_size)

{
  undefined1 auVar1 [16];
  longlong lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if (is_enc == 0) {
    __assert_fail("is_enc && \"decryption is not supported (yet)\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/fusion.c"
                  ,0x2af,
                  "void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *, int, const void *, size_t)"
                 );
  }
  uVar3 = 10;
  if (key_size != 0x10) {
    if (key_size != 0x20) {
      __assert_fail("!\"invalid key size; AES128 / AES256 are supported\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/fusion.c"
                    ,699,
                    "void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *, int, const void *, size_t)"
                   );
    }
    uVar3 = 0xe;
  }
  ctx->rounds = uVar3;
  lVar2 = *(longlong *)((long)key + 8);
  ctx->keys[0][0] = *key;
  ctx->keys[0][1] = lVar2;
  uVar5 = 1;
  if (key_size == 0x20) {
    lVar2 = *(longlong *)((long)key + 0x18);
    ctx->keys[1][0] = *(longlong *)((long)key + 0x10);
    ctx->keys[1][1] = lVar2;
    uVar5 = 2;
  }
  uVar4 = key_size >> 4;
  auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar5 - uVar4) * 0x10);
  uVar6 = (ulong)(uint)((int)uVar5 << 4);
  auVar7 = aeskeygenassist(*(undefined1 (*) [16])((long)(ctx->keys + -1) + uVar6),1);
  auVar7 = vpshufd_avx(auVar7,0xff);
  auVar8 = vpslldq_avx(auVar1,4);
  auVar1 = auVar1 ^ auVar8;
  auVar8 = vpslldq_avx(auVar1,4);
  auVar1 = auVar1 ^ auVar8;
  auVar8 = vpslldq_avx(auVar1,4);
  auVar7 = auVar7 ^ auVar8 ^ auVar1;
  *(undefined1 (*) [16])((long)ctx->keys[0] + uVar6) = auVar7;
  if (uVar5 != ctx->rounds) {
    uVar6 = uVar5 + 1;
    if (0x18 < key_size) {
      auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar6 - uVar4) * 0x10);
      auVar7 = aeskeygenassist(auVar7,1);
      auVar7 = vpshufd_avx(auVar7,0xaa);
      auVar8 = vpslldq_avx(auVar1,4);
      auVar1 = auVar1 ^ auVar8;
      auVar8 = vpslldq_avx(auVar1,4);
      auVar1 = auVar1 ^ auVar8;
      auVar8 = vpslldq_avx(auVar1,4);
      *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar6 << 4)) =
           auVar7 ^ auVar8 ^ auVar1;
      uVar6 = uVar5 + 2;
    }
    auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar6 - uVar4) * 0x10);
    uVar5 = (ulong)(uint)((int)uVar6 << 4);
    auVar7 = aeskeygenassist(*(undefined1 (*) [16])((long)(ctx->keys + -1) + uVar5),2);
    auVar7 = vpshufd_avx(auVar7,0xff);
    auVar8 = vpslldq_avx(auVar1,4);
    auVar1 = auVar1 ^ auVar8;
    auVar8 = vpslldq_avx(auVar1,4);
    auVar1 = auVar1 ^ auVar8;
    auVar8 = vpslldq_avx(auVar1,4);
    auVar7 = auVar7 ^ auVar8 ^ auVar1;
    *(undefined1 (*) [16])((long)ctx->keys[0] + uVar5) = auVar7;
    uVar5 = uVar6;
    if (uVar6 != ctx->rounds) {
      uVar5 = uVar6 + 1;
      if (0x18 < key_size) {
        auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar5 - uVar4) * 0x10);
        auVar7 = aeskeygenassist(auVar7,2);
        auVar7 = vpshufd_avx(auVar7,0xaa);
        auVar8 = vpslldq_avx(auVar1,4);
        auVar1 = auVar1 ^ auVar8;
        auVar8 = vpslldq_avx(auVar1,4);
        auVar1 = auVar1 ^ auVar8;
        auVar8 = vpslldq_avx(auVar1,4);
        *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar5 << 4)) =
             auVar7 ^ auVar8 ^ auVar1;
        uVar5 = uVar6 + 2;
      }
      auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar5 - uVar4) * 0x10);
      uVar6 = (ulong)(uint)((int)uVar5 << 4);
      auVar7 = aeskeygenassist(*(undefined1 (*) [16])((long)(ctx->keys + -1) + uVar6),4);
      auVar7 = vpshufd_avx(auVar7,0xff);
      auVar8 = vpslldq_avx(auVar1,4);
      auVar1 = auVar1 ^ auVar8;
      auVar8 = vpslldq_avx(auVar1,4);
      auVar1 = auVar1 ^ auVar8;
      auVar8 = vpslldq_avx(auVar1,4);
      auVar7 = auVar7 ^ auVar8 ^ auVar1;
      *(undefined1 (*) [16])((long)ctx->keys[0] + uVar6) = auVar7;
      if (uVar5 != ctx->rounds) {
        uVar6 = uVar5 + 1;
        if (0x18 < key_size) {
          auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar6 - uVar4) * 0x10);
          auVar7 = aeskeygenassist(auVar7,4);
          auVar7 = vpshufd_avx(auVar7,0xaa);
          auVar8 = vpslldq_avx(auVar1,4);
          auVar1 = auVar1 ^ auVar8;
          auVar8 = vpslldq_avx(auVar1,4);
          auVar1 = auVar1 ^ auVar8;
          auVar8 = vpslldq_avx(auVar1,4);
          *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar6 << 4)) =
               auVar7 ^ auVar8 ^ auVar1;
          uVar6 = uVar5 + 2;
        }
        auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar6 - uVar4) * 0x10);
        uVar5 = (ulong)(uint)((int)uVar6 << 4);
        auVar7 = aeskeygenassist(*(undefined1 (*) [16])((long)(ctx->keys + -1) + uVar5),8);
        auVar7 = vpshufd_avx(auVar7,0xff);
        auVar8 = vpslldq_avx(auVar1,4);
        auVar1 = auVar1 ^ auVar8;
        auVar8 = vpslldq_avx(auVar1,4);
        auVar1 = auVar1 ^ auVar8;
        auVar8 = vpslldq_avx(auVar1,4);
        auVar7 = auVar7 ^ auVar8 ^ auVar1;
        *(undefined1 (*) [16])((long)ctx->keys[0] + uVar5) = auVar7;
        uVar5 = uVar6;
        if (uVar6 != ctx->rounds) {
          uVar5 = uVar6 + 1;
          if (0x18 < key_size) {
            auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar5 - uVar4) * 0x10);
            auVar7 = aeskeygenassist(auVar7,8);
            auVar7 = vpshufd_avx(auVar7,0xaa);
            auVar8 = vpslldq_avx(auVar1,4);
            auVar1 = auVar1 ^ auVar8;
            auVar8 = vpslldq_avx(auVar1,4);
            auVar1 = auVar1 ^ auVar8;
            auVar8 = vpslldq_avx(auVar1,4);
            *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar5 << 4)) =
                 auVar7 ^ auVar8 ^ auVar1;
            uVar5 = uVar6 + 2;
          }
          auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar5 - uVar4) * 0x10);
          uVar6 = (ulong)(uint)((int)uVar5 << 4);
          auVar7 = aeskeygenassist(*(undefined1 (*) [16])((long)(ctx->keys + -1) + uVar6),0x10);
          auVar7 = vpshufd_avx(auVar7,0xff);
          auVar8 = vpslldq_avx(auVar1,4);
          auVar1 = auVar1 ^ auVar8;
          auVar8 = vpslldq_avx(auVar1,4);
          auVar1 = auVar1 ^ auVar8;
          auVar8 = vpslldq_avx(auVar1,4);
          auVar7 = auVar7 ^ auVar8 ^ auVar1;
          *(undefined1 (*) [16])((long)ctx->keys[0] + uVar6) = auVar7;
          if (uVar5 != ctx->rounds) {
            uVar6 = uVar5 + 1;
            if (0x18 < key_size) {
              auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar6 - uVar4) * 0x10);
              auVar7 = aeskeygenassist(auVar7,0x10);
              auVar7 = vpshufd_avx(auVar7,0xaa);
              auVar8 = vpslldq_avx(auVar1,4);
              auVar1 = auVar1 ^ auVar8;
              auVar8 = vpslldq_avx(auVar1,4);
              auVar1 = auVar1 ^ auVar8;
              auVar8 = vpslldq_avx(auVar1,4);
              *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar6 << 4)) =
                   auVar7 ^ auVar8 ^ auVar1;
              uVar6 = uVar5 + 2;
            }
            auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar6 - uVar4) * 0x10);
            uVar5 = (ulong)(uint)((int)uVar6 << 4);
            auVar7 = aeskeygenassist(*(undefined1 (*) [16])((long)(ctx->keys + -1) + uVar5),0x20);
            auVar7 = vpshufd_avx(auVar7,0xff);
            auVar8 = vpslldq_avx(auVar1,4);
            auVar1 = auVar1 ^ auVar8;
            auVar8 = vpslldq_avx(auVar1,4);
            auVar1 = auVar1 ^ auVar8;
            auVar8 = vpslldq_avx(auVar1,4);
            auVar7 = auVar7 ^ auVar8 ^ auVar1;
            *(undefined1 (*) [16])((long)ctx->keys[0] + uVar5) = auVar7;
            uVar5 = uVar6;
            if (uVar6 != ctx->rounds) {
              uVar5 = uVar6 + 1;
              if (0x18 < key_size) {
                auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar5 - uVar4) * 0x10);
                auVar7 = aeskeygenassist(auVar7,0x20);
                auVar7 = vpshufd_avx(auVar7,0xaa);
                auVar8 = vpslldq_avx(auVar1,4);
                auVar1 = auVar1 ^ auVar8;
                auVar8 = vpslldq_avx(auVar1,4);
                auVar1 = auVar1 ^ auVar8;
                auVar8 = vpslldq_avx(auVar1,4);
                *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar5 << 4)) =
                     auVar7 ^ auVar8 ^ auVar1;
                uVar5 = uVar6 + 2;
              }
              auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar5 - uVar4) * 0x10);
              uVar6 = (ulong)(uint)((int)uVar5 << 4);
              auVar7 = aeskeygenassist(*(undefined1 (*) [16])((long)(ctx->keys + -1) + uVar6),0x40);
              auVar7 = vpshufd_avx(auVar7,0xff);
              auVar8 = vpslldq_avx(auVar1,4);
              auVar1 = auVar1 ^ auVar8;
              auVar8 = vpslldq_avx(auVar1,4);
              auVar1 = auVar1 ^ auVar8;
              auVar8 = vpslldq_avx(auVar1,4);
              auVar7 = auVar7 ^ auVar8 ^ auVar1;
              *(undefined1 (*) [16])((long)ctx->keys[0] + uVar6) = auVar7;
              if (uVar5 != ctx->rounds) {
                uVar6 = uVar5 + 1;
                if (0x18 < key_size) {
                  auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar6 - uVar4) * 0x10);
                  auVar7 = aeskeygenassist(auVar7,0x40);
                  auVar7 = vpshufd_avx(auVar7,0xaa);
                  auVar8 = vpslldq_avx(auVar1,4);
                  auVar1 = auVar1 ^ auVar8;
                  auVar8 = vpslldq_avx(auVar1,4);
                  auVar1 = auVar1 ^ auVar8;
                  auVar8 = vpslldq_avx(auVar1,4);
                  *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar6 << 4)) =
                       auVar7 ^ auVar8 ^ auVar1;
                  uVar6 = uVar5 + 2;
                }
                auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar6 - uVar4) * 0x10);
                uVar5 = (ulong)(uint)((int)uVar6 << 4);
                auVar7 = aeskeygenassist(*(undefined1 (*) [16])((long)(ctx->keys + -1) + uVar5),0x80
                                        );
                auVar7 = vpshufd_avx(auVar7,0xff);
                auVar8 = vpslldq_avx(auVar1,4);
                auVar1 = auVar1 ^ auVar8;
                auVar8 = vpslldq_avx(auVar1,4);
                auVar1 = auVar1 ^ auVar8;
                auVar8 = vpslldq_avx(auVar1,4);
                auVar7 = auVar7 ^ auVar8 ^ auVar1;
                *(undefined1 (*) [16])((long)ctx->keys[0] + uVar5) = auVar7;
                uVar5 = uVar6;
                if (uVar6 != ctx->rounds) {
                  uVar5 = uVar6 + 1;
                  if (0x18 < key_size) {
                    auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar5 - uVar4) * 0x10);
                    auVar7 = aeskeygenassist(auVar7,0x80);
                    auVar7 = vpshufd_avx(auVar7,0xaa);
                    auVar8 = vpslldq_avx(auVar1,4);
                    auVar1 = auVar1 ^ auVar8;
                    auVar8 = vpslldq_avx(auVar1,4);
                    auVar1 = auVar1 ^ auVar8;
                    auVar8 = vpslldq_avx(auVar1,4);
                    *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar5 << 4)) =
                         auVar7 ^ auVar8 ^ auVar1;
                    uVar5 = uVar6 + 2;
                  }
                  auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar5 - uVar4) * 0x10);
                  uVar6 = (ulong)(uint)((int)uVar5 << 4);
                  auVar7 = aeskeygenassist(*(undefined1 (*) [16])((long)(ctx->keys + -1) + uVar6),
                                           0x1b);
                  auVar7 = vpshufd_avx(auVar7,0xff);
                  auVar8 = vpslldq_avx(auVar1,4);
                  auVar1 = auVar1 ^ auVar8;
                  auVar8 = vpslldq_avx(auVar1,4);
                  auVar1 = auVar1 ^ auVar8;
                  auVar8 = vpslldq_avx(auVar1,4);
                  auVar7 = auVar7 ^ auVar8 ^ auVar1;
                  *(undefined1 (*) [16])((long)ctx->keys[0] + uVar6) = auVar7;
                  if (uVar5 != ctx->rounds) {
                    uVar6 = uVar5 + 1;
                    if (0x18 < key_size) {
                      auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar6 - uVar4) * 0x10);
                      auVar7 = aeskeygenassist(auVar7,0x1b);
                      auVar7 = vpshufd_avx(auVar7,0xaa);
                      auVar8 = vpslldq_avx(auVar1,4);
                      auVar1 = auVar1 ^ auVar8;
                      auVar8 = vpslldq_avx(auVar1,4);
                      auVar1 = auVar1 ^ auVar8;
                      auVar8 = vpslldq_avx(auVar1,4);
                      *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar6 << 4)) =
                           auVar7 ^ auVar8 ^ auVar1;
                      uVar6 = uVar5 + 2;
                    }
                    auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar6 - uVar4) * 0x10);
                    uVar5 = (ulong)(uint)((int)uVar6 << 4);
                    auVar7 = aeskeygenassist(*(undefined1 (*) [16])((long)(ctx->keys + -1) + uVar5),
                                             0x36);
                    auVar7 = vpshufd_avx(auVar7,0xff);
                    auVar8 = vpslldq_avx(auVar1,4);
                    auVar1 = auVar1 ^ auVar8;
                    auVar8 = vpslldq_avx(auVar1,4);
                    auVar1 = auVar1 ^ auVar8;
                    auVar8 = vpslldq_avx(auVar1,4);
                    auVar7 = auVar7 ^ auVar8 ^ auVar1;
                    *(undefined1 (*) [16])((long)ctx->keys[0] + uVar5) = auVar7;
                    uVar5 = uVar6;
                    if ((uVar6 != ctx->rounds) && (uVar5 = uVar6 + 1, 0x18 < key_size)) {
                      auVar1 = *(undefined1 (*) [16])((long)ctx + (uVar5 - uVar4) * 0x10);
                      auVar7 = aeskeygenassist(auVar7,0x36);
                      auVar7 = vpshufd_avx(auVar7,0xaa);
                      auVar8 = vpslldq_avx(auVar1,4);
                      auVar1 = auVar1 ^ auVar8;
                      auVar8 = vpslldq_avx(auVar1,4);
                      auVar1 = auVar1 ^ auVar8;
                      auVar8 = vpslldq_avx(auVar1,4);
                      *(undefined1 (*) [16])((long)ctx->keys[0] + (ulong)(uint)((int)uVar5 << 4)) =
                           auVar7 ^ auVar8 ^ auVar1;
                      uVar5 = uVar6 + 2;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if ((uint)uVar5 != ctx->rounds) {
    __assert_fail("i == ctx->rounds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/fusion.c"
                  ,0x2dc,
                  "void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *, int, const void *, size_t)"
                 );
  }
  return;
}

Assistant:

void ptls_fusion_aesecb_init(ptls_fusion_aesecb_context_t *ctx, int is_enc, const void *key, size_t key_size)
{
    assert(is_enc && "decryption is not supported (yet)");

    size_t i = 0;

    switch (key_size) {
    case 16: /* AES128 */
        ctx->rounds = 10;
        break;
    case 32: /* AES256 */
        ctx->rounds = 14;
        break;
    default:
        assert(!"invalid key size; AES128 / AES256 are supported");
        break;
    }

    ctx->keys[i++] = _mm_loadu_si128((__m128i *)key);
    if (key_size == 32)
        ctx->keys[i++] = _mm_loadu_si128((__m128i *)key + 1);

#define EXPAND(R)                                                                                                                  \
    do {                                                                                                                           \
        ctx->keys[i] = expand_key(ctx->keys[i - key_size / 16],                                                                    \
                                  _mm_shuffle_epi32(_mm_aeskeygenassist_si128(ctx->keys[i - 1], R), _MM_SHUFFLE(3, 3, 3, 3)));     \
        if (i == ctx->rounds)                                                                                                      \
            goto Done;                                                                                                             \
        ++i;                                                                                                                       \
        if (key_size > 24) {                                                                                                       \
            ctx->keys[i] = expand_key(ctx->keys[i - key_size / 16],                                                                \
                                      _mm_shuffle_epi32(_mm_aeskeygenassist_si128(ctx->keys[i - 1], R), _MM_SHUFFLE(2, 2, 2, 2))); \
            ++i;                                                                                                                   \
        }                                                                                                                          \
    } while (0)
    EXPAND(0x1);
    EXPAND(0x2);
    EXPAND(0x4);
    EXPAND(0x8);
    EXPAND(0x10);
    EXPAND(0x20);
    EXPAND(0x40);
    EXPAND(0x80);
    EXPAND(0x1b);
    EXPAND(0x36);
#undef EXPAND
Done:
    assert(i == ctx->rounds);
}